

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void ReadConfigROM(BasePort *port,uint boardNum)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  size_t i_1;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  size_t i_2;
  uint uVar7;
  quadlet_t read_data;
  quadlet_t block_data [24];
  undefined1 local_a4 [4];
  BasePort *local_a0;
  uint local_98;
  uint local_94 [25];
  
  uVar5 = (ulong)boardNum & 0xff;
  iVar2 = (*port->_vptr_BasePort[0x23])(port,uVar5,0xfffff0000400,local_a4);
  if ((char)iVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Configuration ROM: ",0x13);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing with block read (first entry should be ROM, followed by bus info):",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  iVar2 = (*port->_vptr_BasePort[0x26])(port,uVar5,0xfffff0000400,&local_98,0x60);
  if ((char)iVar2 != '\0') {
    lVar6 = 0;
    do {
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      if ((&DAT_0012e2c1)[lVar1] == '\0') {
        std::ios::widen((char)lVar1 + -0x20);
        (&DAT_0012e2c1)[lVar1] = 1;
      }
      setsockopt[lVar1] = (code)0x30;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      if ((~(uint)lVar6 & 3) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x18);
  }
  local_a0 = port;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Bus_Info length = ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (0x1ffffff <
      (local_98 >> 0x18 | (local_98 & 0xff0000) >> 8 | (local_98 & 0xff00) << 8 | local_98 << 0x18))
  {
    uVar4 = 0;
    do {
      uVar4 = uVar4 + 1;
    } while ((local_98 & 0xff) * 4 != uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Bus_Info CRC: ROM = ",0x14);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Computed = ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    lVar6 = *(long *)poVar3;
    lVar1 = *(long *)(lVar6 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    uVar7 = local_94[local_98 & 0xff];
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Root_Directory length = ",0x18);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (0xffff < uVar7) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
      } while ((uVar7 >> 0x10) << 2 != uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Root_Dir CRC: ROM = ",0x14);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Computed = ",0xd);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    lVar6 = *(long *)poVar3;
    lVar1 = *(long *)(lVar6 + -0x18);
    *(uint *)(poVar3 + lVar1 + 0x18) = *(uint *)(poVar3 + lVar1 + 0x18) & 0xffffffb5 | 2;
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Testing again with block read (8th entry should be ROM, followed by bus info):",0x4e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  iVar2 = (*local_a0->_vptr_BasePort[0x26])(local_a0,uVar5,0xfffff00003e4,&local_98,0x60);
  if ((char)iVar2 != '\0') {
    lVar6 = 0;
    do {
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      if ((&DAT_0012e2c1)[lVar1] == '\0') {
        std::ios::widen((char)lVar1 + -0x20);
        (&DAT_0012e2c1)[lVar1] = 1;
      }
      setsockopt[lVar1] = (code)0x30;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
      if ((~(uint)lVar6 & 3) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x18);
  }
  return;
}

Assistant:

void ReadConfigROM(BasePort *port, unsigned int boardNum)
{
    nodeaddr_t addr;
    quadlet_t read_data;
    quadlet_t block_data[24];
    addr = 0xfffff0000400;  // Configuration ROM address
    if (port->ReadQuadlet(boardNum, addr, read_data))
        std::cout << "Configuration ROM: " << std::hex << read_data << std::endl;
    std::cout << "Testing with block read (first entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr, block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
    unsigned int bus_info_len = (bswap_32(block_data[0])&0xff000000) >> 24;
    std::cout << "Bus_Info length = " << bus_info_len << std::endl;
    if (bus_info_len > 1) {
        unsigned int bus_info_crc = bswap_32(block_data[0])&0x0000ffff;
        uint16_t crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[1]), bus_info_len*sizeof(quadlet_t));
        std::cout << "Bus_Info CRC: ROM = " << std::hex << bus_info_crc << ", Computed = " << crc16 << std::dec << std::endl;
        unsigned int root_len = (bswap_32(block_data[bus_info_len+1])&0xffff0000) >> 16;
        unsigned int root_dir_crc = bswap_32(block_data[bus_info_len+1])&0x0000ffff;
        std::cout << "Root_Directory length = " << root_len << std::endl;
        crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[bus_info_len+2]), root_len*sizeof(quadlet_t));
        std::cout << "Root_Dir CRC: ROM = " << std::hex << root_dir_crc << ", Computed = " << crc16 << std::dec << std::endl;
    }
    std::cout << std::endl;
    std::cout << "Testing again with block read (8th entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr-7*sizeof(quadlet_t), block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
}